

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

double xmlXPathPopNumber(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr *ppxVar2;
  uint uVar3;
  xmlXPathObjectPtr pxVar4;
  double dVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    xmlXPathErr((xmlXPathParserContextPtr)0x0,10);
  }
  else {
    iVar1 = ctxt->valueNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->valueNr = uVar3;
      ppxVar2 = ctxt->valueTab;
      if (iVar1 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlXPathObjectPtr)0x0;
      if (pxVar4 != (xmlXPathObjectPtr)0x0) {
        if (pxVar4->type == XPATH_NUMBER) {
          dVar5 = pxVar4->floatval;
        }
        else {
          dVar5 = xmlXPathCastToNumberInternal(ctxt,pxVar4);
        }
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        return dVar5;
      }
    }
    xmlXPathErr(ctxt,10);
    ctxt->error = 10;
  }
  return 0.0;
}

Assistant:

double
xmlXPathPopNumber (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    double ret;

    obj = xmlXPathValuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(0);
    }
    if (obj->type != XPATH_NUMBER)
	ret = xmlXPathCastToNumberInternal(ctxt, obj);
    else
        ret = obj->floatval;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}